

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

char * __thiscall icu_63::IslamicCalendar::getType(IslamicCalendar *this)

{
  char *local_18;
  char *sType;
  IslamicCalendar *this_local;
  
  switch(*(undefined4 *)&(this->super_Calendar).field_0x264) {
  case 0:
    local_18 = "islamic";
    break;
  case 1:
    local_18 = "islamic-civil";
    break;
  case 2:
    local_18 = "islamic-umalqura";
    break;
  case 3:
    local_18 = "islamic-tbla";
    break;
  default:
    local_18 = "islamic";
  }
  return local_18;
}

Assistant:

const char *IslamicCalendar::getType() const {
    const char *sType = NULL;

    switch (cType) {
    case CIVIL:
        sType = "islamic-civil";
        break;
    case ASTRONOMICAL:
        sType = "islamic";
        break;
    case TBLA:
        sType = "islamic-tbla";
        break;
    case UMALQURA:
        sType = "islamic-umalqura";
        break;
    default:
        U_ASSERT(false); // out of range
        sType = "islamic";  // "islamic" is used as the generic type
        break;
    }
    return sType;
}